

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  __type _Var2;
  string *this_00;
  GeneratorExpressionContent *content_00;
  string result;
  cmTarget *target;
  string name;
  string sStack_b8;
  cmTarget *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  content_00 = content;
  std::__cxx11::string::string
            ((string *)&local_50,
             (string *)
             (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  bVar1 = cmGeneratorExpression::IsValidTargetName(&local_50);
  if (bVar1) {
    local_98 = cmMakefile::FindTargetToUse(context->Makefile,&local_50,false);
    if (local_98 == (cmTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&sStack_b8,content);
      std::operator+(&local_70,"No target \"",&local_50);
      std::operator+(&local_90,&local_70,"\"");
      reportError(context,&sStack_b8,&local_90);
    }
    else {
      if (local_98->TargetTypeValue == UNKNOWN_LIBRARY || (int)local_98->TargetTypeValue < 4) {
        if (dagChecker != (cmGeneratorExpressionDAGChecker *)0x0) {
          bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                            (dagChecker,local_50._M_dataplus._M_p);
          if (bVar1) {
LAB_0036f366:
            GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&sStack_b8,content);
            std::__cxx11::string::string
                      ((string *)&local_90,
                       "Expressions which require the linker language may not be used while evaluating link libraries"
                       ,(allocator *)&local_70);
            reportError(context,&sStack_b8,&local_90);
            goto LAB_0036f3ca;
          }
          bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagChecker);
          if (bVar1) {
            cmGeneratorExpressionDAGChecker::TopTarget_abi_cxx11_(&sStack_b8,dagChecker);
            _Var2 = std::operator==(&local_50,&sStack_b8);
            std::__cxx11::string::~string((string *)&sStack_b8);
            if (_Var2) goto LAB_0036f366;
          }
        }
        std::
        _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
        ::_M_insert_unique<cmTarget*const&>
                  ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                    *)&context->DependTargets,&local_98);
        std::
        _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
        ::_M_insert_unique<cmTarget_const*const&>
                  ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                    *)&context->AllTargets,&local_98);
        TargetFilesystemArtifactResultCreator<ArtifactPdbTag>::Create_abi_cxx11_
                  (&sStack_b8,(TargetFilesystemArtifactResultCreator<ArtifactPdbTag> *)local_98,
                   (cmTarget *)context,(cmGeneratorExpressionContext *)content,content_00);
        if (context->HadError == true) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        }
        else {
          cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&sStack_b8);
        }
        std::__cxx11::string::~string((string *)&sStack_b8);
        goto LAB_0036f490;
      }
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&sStack_b8,content);
      std::operator+(&local_70,"Target \"",&local_50);
      std::operator+(&local_90,&local_70,"\" is not an executable or library.");
      reportError(context,&sStack_b8,&local_90);
    }
    std::__cxx11::string::~string((string *)&local_90);
    this_00 = &local_70;
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&sStack_b8,content);
    std::__cxx11::string::string
              ((string *)&local_90,"Expression syntax not recognized.",(allocator *)&local_70);
    reportError(context,&sStack_b8,&local_90);
LAB_0036f3ca:
    this_00 = &local_90;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&sStack_b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0036f490:
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *dagChecker) const
  {
    // Lookup the referenced target.
    std::string name = *parameters.begin();

    if (!cmGeneratorExpression::IsValidTargetName(name))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return std::string();
      }
    cmTarget* target = context->Makefile->FindTargetToUse(name);
    if(!target)
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return std::string();
      }
    if(target->GetType() >= cmTarget::OBJECT_LIBRARY &&
      target->GetType() != cmTarget::UNKNOWN_LIBRARY)
      {
      ::reportError(context, content->GetOriginalExpression(),
                  "Target \"" + name + "\" is not an executable or library.");
      return std::string();
      }
    if (dagChecker && (dagChecker->EvaluatingLinkLibraries(name.c_str())
        || (dagChecker->EvaluatingSources()
          && name == dagChecker->TopTarget())))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return std::string();
      }
    context->DependTargets.insert(target);
    context->AllTargets.insert(target);

    std::string result =
                TargetFilesystemArtifactResultCreator<ArtifactT>::Create(
                          target,
                          context,
                          content);
    if (context->HadError)
      {
      return std::string();
      }
    return
        TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }